

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O1

void __thiscall AV1Kmeans::AV1KmeansTest2::SetUp(AV1KmeansTest2 *this)

{
  uint32_t uVar1;
  int i;
  long lVar2;
  
  (this->rnd_).random_.state_ = 0xbaba;
  lVar2 = 0;
  do {
    uVar1 = testing::internal::Random::Generate(&(this->rnd_).random_,0x80000000);
    this->data_[lVar2] = (ushort)(uVar1 >> 0x17) & 0xff;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x2000);
  lVar2 = 0;
  do {
    uVar1 = testing::internal::Random::Generate(&(this->rnd_).random_,0x80000000);
    this->centroids_[lVar2] = (ushort)(uVar1 >> 0x17) & 0xff;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void AV1KmeansTest2::SetUp() {
  rnd_.Reset(libaom_test::ACMRandom::DeterministicSeed());
  for (int i = 0; i < 4096 * 2; ++i) {
    data_[i] = (int)rnd_.Rand8();
  }
  for (int i = 0; i < 8 * 2; i++) {
    centroids_[i] = (int)rnd_.Rand8();
  }
}